

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::CountOuters(SQFuncState *this,SQInteger stacksize)

{
  SQLocalVarInfo *pSVar1;
  long in_RSI;
  long in_RDI;
  SQLocalVarInfo *lvi;
  SQInteger k;
  SQInteger outers;
  SQUnsignedInteger local_20;
  long local_18;
  
  local_18 = 0;
  local_20 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 8));
  while (local_20 = local_20 - 1, in_RSI <= (long)local_20) {
    pSVar1 = sqvector<SQLocalVarInfo>::operator[]((sqvector<SQLocalVarInfo> *)(in_RDI + 8),local_20)
    ;
    if (pSVar1->_end_op == 0xffffffffffffffff) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

SQInteger SQFuncState::CountOuters(SQInteger stacksize)
{
    SQInteger outers = 0;
    SQInteger k = _vlocals.size() - 1;
    while(k >= stacksize) {
        SQLocalVarInfo &lvi = _vlocals[k];
        k--;
        if(lvi._end_op == UINT_MINUS_ONE) { //this means is an outer
            outers++;
        }
    }
    return outers;
}